

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

void __thiscall
soul::TokenisedPathString::TokenisedPathString(TokenisedPathString *this,string *path)

{
  Section local_60;
  Section local_50 [2];
  size_t local_30;
  size_type nextBreak;
  size_type length;
  size_t currentSectionStart;
  string *path_local;
  TokenisedPathString *this_local;
  
  currentSectionStart = (size_t)path;
  path_local = &this->fullPath;
  std::__cxx11::string::string((string *)this,(string *)path);
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::ArrayWithPreallocation
            (&this->sections);
  length = 0;
  nextBreak = std::__cxx11::string::length();
  while( true ) {
    if (nextBreak <= length) {
      return;
    }
    local_30 = std::__cxx11::string::find((char *)this,0x4ae19b);
    checkAssertion(local_30 != 0,"nextBreak != 0","TokenisedPathString",0x7d);
    if (local_30 == 0xffffffffffffffff) break;
    local_60.start = length;
    local_60.end = local_30;
    ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::push_back
              (&this->sections,&local_60);
    length = local_30 + 2;
  }
  local_50[0].start = length;
  local_50[0].end = nextBreak;
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::push_back
            (&this->sections,local_50);
  return;
}

Assistant:

TokenisedPathString (std::string path) : fullPath (std::move (path))
    {
        size_t currentSectionStart = 0;
        auto length = fullPath.length();

        while (currentSectionStart < length)
        {
            auto nextBreak = fullPath.find ("::", currentSectionStart);
            SOUL_ASSERT (nextBreak != 0);

            if (nextBreak == std::string::npos)
            {
                sections.push_back ({ currentSectionStart, length });
                break;
            }

            sections.push_back ({ currentSectionStart, nextBreak });
            currentSectionStart = nextBreak + 2;
        }
    }